

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ARGBColorTableRow_C(uint8_t *dst_argb,uint8_t *table_argb,int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = 0;
  uVar5 = (ulong)(uint)width;
  if (width < 1) {
    uVar5 = uVar4;
  }
  for (; (int)uVar5 != (int)uVar4; uVar4 = uVar4 + 1) {
    bVar1 = dst_argb[uVar4 * 4 + 1];
    bVar2 = dst_argb[uVar4 * 4 + 2];
    bVar3 = dst_argb[uVar4 * 4 + 3];
    dst_argb[uVar4 * 4] = table_argb[(ulong)dst_argb[uVar4 * 4] * 4];
    dst_argb[uVar4 * 4 + 1] = table_argb[(ulong)bVar1 * 4 + 1];
    dst_argb[uVar4 * 4 + 2] = table_argb[(ulong)bVar2 * 4 + 2];
    dst_argb[uVar4 * 4 + 3] = table_argb[(ulong)bVar3 * 4 + 3];
  }
  return;
}

Assistant:

void ARGBColorTableRow_C(uint8_t* dst_argb,
                         const uint8_t* table_argb,
                         int width) {
  int x;
  for (x = 0; x < width; ++x) {
    int b = dst_argb[0];
    int g = dst_argb[1];
    int r = dst_argb[2];
    int a = dst_argb[3];
    dst_argb[0] = table_argb[b * 4 + 0];
    dst_argb[1] = table_argb[g * 4 + 1];
    dst_argb[2] = table_argb[r * 4 + 2];
    dst_argb[3] = table_argb[a * 4 + 3];
    dst_argb += 4;
  }
}